

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O3

void __thiscall QUrlQuery::removeQueryItem(QUrlQuery *this,QString *key)

{
  QUrlQueryPrivate *this_00;
  iterator abegin;
  iterator iVar1;
  Map *this_01;
  
  if ((this->d).d.ptr != (QUrlQueryPrivate *)0x0) {
    QSharedDataPointer<QUrlQueryPrivate>::detach(&this->d);
    this_00 = (this->d).d.ptr;
    abegin = QUrlQueryPrivate::findKey(this_00,key);
    this_01 = &this_00->itemList;
    iVar1 = QList<std::pair<QString,_QString>_>::end(this_01);
    if (abegin.i != iVar1.i) {
      QList<std::pair<QString,_QString>_>::erase(this_01,(const_iterator)abegin.i,abegin.i + 1);
      return;
    }
  }
  return;
}

Assistant:

void QUrlQuery::removeQueryItem(const QString &key)
{
    if (d.constData()) {
        auto *p = d.data();
        Map::iterator it = p->findKey(key);
        if (it != p->itemList.end())
            p->itemList.erase(it);
    }
}